

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

void xmlDebugDumpNodeList(FILE *output,xmlNodePtr node,int depth)

{
  xmlDebugCtxt local_b0;
  
  if (output == (FILE *)0x0) {
    output = _stdout;
  }
  local_b0.check = 0;
  local_b0.errors = 0;
  local_b0.nodict = 0;
  local_b0.options = 0;
  local_b0.doc = (xmlDocPtr)0x0;
  local_b0.node = (xmlNodePtr)0x0;
  local_b0.dict = (xmlDictPtr)0x0;
  builtin_strncpy(local_b0.shift,
                  "                                                                                                    "
                  ,0x65);
  if (node != (xmlNodePtr)0x0) {
    local_b0.output = output;
    local_b0.depth = depth;
    do {
      xmlCtxtDumpNode(&local_b0,node);
      node = node->next;
    } while (node != (_xmlNode *)0x0);
  }
  return;
}

Assistant:

void
xmlDebugDumpNodeList(FILE * output, xmlNodePtr node, int depth)
{
    xmlDebugCtxt ctxt;

    if (output == NULL)
	output = stdout;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    ctxt.depth = depth;
    xmlCtxtDumpNodeList(&ctxt, node);
    xmlCtxtDumpCleanCtxt(&ctxt);
}